

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,int element)

{
  int local_14;
  
  Align(this,4);
  vector_downward<unsigned_int>::push_small<int>(&this->buf_,&local_14);
  return (this->buf_).size_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }